

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Book.cpp
# Opt level: O2

bool __thiscall BookChoose::loadBook(BookChoose *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  int iVar3;
  int row;
  int col;
  int row_00;
  int iVar4;
  UCT uct;
  char mov;
  char ch;
  mapped_type local_2c8 [2];
  uint local_2b8;
  int bookSize;
  int local_2b0;
  int I;
  BitBoard op;
  BitBoard my;
  Position local_298;
  Board tmpBoard;
  ifstream in;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&in,"./book.bin",_S_in|_S_bin);
  if ((abStack_218[*(long *)(_in + -0x18)] & 5) != 0) {
    fwrite("cannot find Opening Book!\n",0x1a,1,_stderr);
  }
  std::istream::read((char *)&in,(long)&bookSize);
  if (bookSize < 1 || (abStack_218[*(long *)(_in + -0x18)] & 5) != 0) {
    fwrite("Opening Book size error !\n",0x1a,1,_stderr);
    std::ifstream::close();
  }
  else {
    iVar3 = 0;
    fprintf(_stderr,"bookSize:%d\n");
    FullSearch::FullSearch(&uct.fullsearch);
    while( true ) {
      if (bookSize <= iVar3) break;
      Board::Board(&tmpBoard);
      std::istream::read((char *)&in,(long)&my);
      std::istream::read((char *)&in,(long)&op);
      tmpBoard.used = op | my;
      tmpBoard.board = my;
      Board::countBoard(&tmpBoard);
      std::istream::read((char *)&in,(long)&mov);
      local_2b8 = 0;
      local_2b0 = iVar3;
      for (iVar4 = 0; iVar4 < mov; iVar4 = iVar4 + 1) {
        tmpBoard.used = op | my;
        tmpBoard.board = my;
        std::istream::read((char *)&in,(long)&ch);
        std::istream::read((char *)&in,(long)&I);
        iVar3 = (int)(ch % '\b');
        row = (int)(ch / '\b');
        row_00 = 7 - row;
        col = 7 - iVar3;
        Position::Position(&local_298,row_00,col);
        bVar1 = Board::isAbleToChoose(&tmpBoard,local_298);
        if (!bVar1) {
          fwrite("errror!!!",9,1,_stderr);
          exit(1);
        }
        if (I < -99999) {
          Position::Position(local_2c8,row_00,col);
          pmVar2 = std::__detail::
                   _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&BadChoose,&tmpBoard);
          *pmVar2 = local_2c8[0];
          Board::turnLeft(&tmpBoard);
          Position::Position(local_2c8,iVar3,row_00);
          pmVar2 = std::__detail::
                   _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&BadChoose,&tmpBoard);
          *pmVar2 = local_2c8[0];
          Board::turnLeft(&tmpBoard);
          Position::Position(local_2c8,row,iVar3);
          pmVar2 = std::__detail::
                   _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&BadChoose,&tmpBoard);
          *pmVar2 = local_2c8[0];
          Board::turnLeft(&tmpBoard);
          Position::Position(local_2c8,col,row);
          pmVar2 = std::__detail::
                   _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&BadChoose,&tmpBoard);
          *pmVar2 = local_2c8[0];
        }
        else if (0 < I && (local_2b8 & 1) == 0) {
          Position::Position(local_2c8,row_00,col);
          pmVar2 = std::__detail::
                   _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&GoodChoose,&tmpBoard);
          *pmVar2 = local_2c8[0];
          Board::turnLeft(&tmpBoard);
          Position::Position(local_2c8,iVar3,row_00);
          pmVar2 = std::__detail::
                   _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&GoodChoose,&tmpBoard);
          *pmVar2 = local_2c8[0];
          Board::turnLeft(&tmpBoard);
          Position::Position(local_2c8,row,iVar3);
          pmVar2 = std::__detail::
                   _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&GoodChoose,&tmpBoard);
          *pmVar2 = local_2c8[0];
          Board::turnLeft(&tmpBoard);
          Position::Position(local_2c8,col,row);
          pmVar2 = std::__detail::
                   _Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<Board,_std::pair<const_Board,_Position>,_std::allocator<std::pair<const_Board,_Position>_>,_std::__detail::_Select1st,_EqualKey,_HashFunc,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&GoodChoose,&tmpBoard);
          *pmVar2 = local_2c8[0];
          local_2b8 = (uint)CONCAT71((int7)((ulong)pmVar2 >> 8),1);
        }
      }
      iVar3 = local_2b0 + 1;
    }
    fprintf(_stderr,"Good_size:%lu\n",GoodChoose._M_h._M_element_count);
    fprintf(_stderr,"Bad_size:%lu\n",BadChoose._M_h._M_element_count);
    std::ifstream::close();
    FullSearch::~FullSearch(&uct.fullsearch);
  }
  std::ifstream::~ifstream(&in);
  return true;
}

Assistant:

bool BookChoose::loadBook() {
    std::ifstream in("./book.bin", std::ios::binary | std::ios::in);
    if (!in) {
        fprintf(stderr, "cannot find Opening Book!\n");
    }

    int bookSize;
    in.read((char *) &bookSize, sizeof(bookSize));
    if (!in || bookSize <= 0) {
        fprintf(stderr, "Opening Book size error !\n");
        in.close();
        return true;
    }

    //book = new Book(bookSize * 3 / 2);
    fprintf(stderr,"bookSize:%d\n",bookSize);
    UCT uct;
    for (int i = 0; i < bookSize; i++) {
        Board tmpBoard;
        //BookNode node;
        BitBoard my,op;
        char ch, mov;
        int I;
        in.read((char *) &my, sizeof(my));
        //node.setMy(bb);
        in.read((char *) &op, sizeof(op));
        //node.setOp(bb);
        tmpBoard.used = my|op;
        tmpBoard.board = my;

        //tmpBoard.printBoard();
        //uct.getNextAction(tmpBoard);
        int black,white ;
        tie(ignore,black,white) = tmpBoard.countBoard();
        in.read(&mov, sizeof(mov));
        //node.setMoveCount(ch);
        //printf("mov:%d\n",mov);
        bool hasGood = false;
        for (int j = 0; j < mov; j++) {
            tmpBoard.used = my|op;
            tmpBoard.board = my;
            in.read(&ch, sizeof(ch));
            in.read((char *) &I, sizeof(I));
            int row= 7-ch/8 , col = 7-ch%8;
//
//            int whiteNum,blackNum;
//            tie(ignore, whiteNum, blackNum) = tmpBoard.countBoard();

            if(!tmpBoard.isAbleToChoose(Position(row,col))){
                fprintf(stderr,"errror!!!");
                exit(1);
            }

            if (I<-99999){
                BadChoose[tmpBoard]=Position(row,col);
                tmpBoard.turnLeft();
                BadChoose[tmpBoard]=Position(7-col,row);
                tmpBoard.turnLeft();
                BadChoose[tmpBoard]=Position(7-row,7-col);
                tmpBoard.turnLeft();
                BadChoose[tmpBoard]=Position(col,7-row);
                continue;
            }
            if (!hasGood && I>0){
                GoodChoose[tmpBoard]=Position(row,col);
                tmpBoard.turnLeft();
                GoodChoose[tmpBoard]=Position(7-col,row);
                tmpBoard.turnLeft();
                GoodChoose[tmpBoard]=Position(7-row,7-col);
                tmpBoard.turnLeft();
                GoodChoose[tmpBoard]=Position(col,7-row);
                hasGood = true;
                continue;
            }




            //node.setMove(j, ch);
            //node.setEval(j, I);
//        }
//        if (!in) {
//            delete book;
//            book = nullptr;
//            in.close();
//            return false;
//        }
//        book->insert(node);
        }

    }
    fprintf(stderr,"Good_size:%lu\n",GoodChoose.size());
    fprintf(stderr, "Bad_size:%lu\n",BadChoose.size());
    in.close();
    return true;
}